

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

bool __thiscall
cmELFInternalImpl<cmELFTypes64>::LoadSectionHeader(cmELFInternalImpl<cmELFTypes64> *this,ELF_Half i)

{
  bool bVar1;
  int iVar2;
  undefined6 in_register_00000032;
  
  iVar2 = (int)CONCAT62(in_register_00000032,i);
  std::istream::seekg((this->super_cmELFInternal).Stream,
                      (ulong)((uint)(this->ELFHeader).e_shentsize * iVar2) +
                      (this->ELFHeader).e_shoff,0);
  bVar1 = Read(this,(ELF_Shdr *)
                    ((long)&((this->SectionHeaders).
                             super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>._M_impl.
                             super__Vector_impl_data._M_start)->sh_name + (ulong)(uint)(iVar2 << 6))
              );
  if ((bVar1) &&
     (*(int *)((long)&((this->SectionHeaders).
                       super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>._M_impl.
                       super__Vector_impl_data._M_start)->sh_type + (ulong)(uint)(iVar2 << 6)) == 6)
     ) {
    (this->super_cmELFInternal).DynamicSectionIndex = iVar2;
  }
  return bVar1;
}

Assistant:

bool LoadSectionHeader(ELF_Half i)
  {
    // Read the section header from the file.
    this->Stream.seekg(this->ELFHeader.e_shoff +
                       this->ELFHeader.e_shentsize * i);
    if (!this->Read(this->SectionHeaders[i])) {
      return false;
    }

    // Identify some important sections.
    if (this->SectionHeaders[i].sh_type == SHT_DYNAMIC) {
      this->DynamicSectionIndex = i;
    }
    return true;
  }